

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Observator.hpp
# Opt level: O0

void __thiscall
Observator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
notifyAllObserver(Observator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *this)

{
  bool bVar1;
  reference ppVar2;
  reference __args;
  value_type *obs;
  const_iterator __end0_1;
  const_iterator __begin0_1;
  unordered_map<unsigned_long,_std::function<bool_()>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::function<bool_()>_>_>_>
  *__range3;
  undefined1 local_98 [8];
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_map<unsigned_long,_std::function<bool_()>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::function<bool_()>_>_>_>_>
  obsEvents;
  iterator __end0;
  iterator __begin0;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_map<unsigned_long,_std::function<bool_()>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::function<bool_()>_>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_map<unsigned_long,_std::function<bool_()>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::function<bool_()>_>_>_>_>_>_>
  *__range2;
  vector<unsigned_long,_std::allocator<unsigned_long>_> toRemove;
  Observator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_local;
  
  toRemove.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)this;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&__range2);
  __end0 = std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_map<unsigned_long,_std::function<bool_()>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::function<bool_()>_>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_map<unsigned_long,_std::function<bool_()>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::function<bool_()>_>_>_>_>_>_>
           ::begin(&this->_observers);
  obsEvents.second._M_h._M_single_bucket =
       (__node_base_ptr)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_map<unsigned_long,_std::function<bool_()>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::function<bool_()>_>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_map<unsigned_long,_std::function<bool_()>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::function<bool_()>_>_>_>_>_>_>
       ::end(&this->_observers);
  while (bVar1 = std::__detail::operator!=
                           (&__end0.
                             super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_map<unsigned_long,_std::function<bool_()>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::function<bool_()>_>_>_>_>,_true>
                            ,(_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_map<unsigned_long,_std::function<bool_()>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::function<bool_()>_>_>_>_>,_true>
                              *)&obsEvents.second._M_h._M_single_bucket), bVar1) {
    ppVar2 = std::__detail::
             _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_map<unsigned_long,_std::function<bool_()>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::function<bool_()>_>_>_>_>,_false,_true>
             ::operator*(&__end0);
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_map<unsigned_long,_std::function<bool_()>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::function<bool_()>_>_>_>_>
    ::pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_map<unsigned_long,_std::function<bool_()>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::function<bool_()>_>_>_>_>
            *)local_98,ppVar2);
    __end0_1 = std::
               unordered_map<unsigned_long,_std::function<bool_()>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::function<bool_()>_>_>_>
               ::begin((unordered_map<unsigned_long,_std::function<bool_()>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::function<bool_()>_>_>_>
                        *)&obsEvents.field_0x18);
    obs = (value_type *)
          std::
          unordered_map<unsigned_long,_std::function<bool_()>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::function<bool_()>_>_>_>
          ::end((unordered_map<unsigned_long,_std::function<bool_()>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::function<bool_()>_>_>_>
                 *)&obsEvents.field_0x18);
    while (bVar1 = std::__detail::operator!=
                             (&__end0_1.
                               super__Node_iterator_base<std::pair<const_unsigned_long,_std::function<bool_()>_>,_false>
                              ,(_Node_iterator_base<std::pair<const_unsigned_long,_std::function<bool_()>_>,_false>
                                *)&obs), bVar1) {
      __args = std::__detail::
               _Node_const_iterator<std::pair<const_unsigned_long,_std::function<bool_()>_>,_false,_false>
               ::operator*(&__end0_1);
      bVar1 = std::function<bool_()>::operator()(&__args->second);
      if (bVar1) {
        std::vector<unsigned_long,std::allocator<unsigned_long>>::emplace_back<unsigned_long_const&>
                  ((vector<unsigned_long,std::allocator<unsigned_long>> *)&__range2,&__args->first);
      }
      std::__detail::
      _Node_const_iterator<std::pair<const_unsigned_long,_std::function<bool_()>_>,_false,_false>::
      operator++(&__end0_1);
    }
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_map<unsigned_long,_std::function<bool_()>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::function<bool_()>_>_>_>_>
    ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_map<unsigned_long,_std::function<bool_()>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::function<bool_()>_>_>_>_>
             *)local_98);
    std::__detail::
    _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_map<unsigned_long,_std::function<bool_()>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::function<bool_()>_>_>_>_>,_false,_true>
    ::operator++(&__end0);
  }
  unregisterIds(this,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)&__range2);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&__range2);
  return;
}

Assistant:

void notifyAllObserver() {
        std::vector<ListenerConnection> toRemove;

        for (const auto obsEvents : this->_observers) {
            for (const auto &obs : obsEvents.second) {
                if (obs.second()) {
                    toRemove.emplace_back(obs.first);
                }
            }
        }

        this->unregisterIds(toRemove);
    }